

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
pbrt::
InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator=(InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *other)

{
  size_t i;
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long lVar4;
  
  if (this != other) {
    clear(this);
    reserve(this,other->nStored);
    lVar4 = 0;
    for (uVar1 = 0; uVar1 < other->nStored; uVar1 = uVar1 + 1) {
      pbVar3 = this->ptr;
      if (this->ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->field_2
        ;
      }
      pbVar2 = other->ptr;
      if (other->ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &other->field_2;
      }
      std::__cxx11::string::string
                ((string *)((long)&pbVar3->_M_dataplus + lVar4),
                 (string *)((long)&pbVar2->_M_dataplus + lVar4));
      lVar4 = lVar4 + 0x20;
    }
    this->nStored = other->nStored;
  }
  return this;
}

Assistant:

InlinedVector &operator=(const InlinedVector &other) {
        if (this == &other)
            return *this;

        clear();
        reserve(other.size());
        for (size_t i = 0; i < other.size(); ++i)
            alloc.template construct<T>(begin() + i, other[i]);
        nStored = other.size();

        return *this;
    }